

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

bool test_SSTable_input(void)

{
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::list<int,_std::allocator<int>_>_> __l_01;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  l;
  allocator_type local_a3;
  allocator_type local_a2;
  allocator_type local_a1;
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  local_a0;
  list<int,_std::allocator<int>_> local_88;
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  local_38 = 0x200000001;
  uStack_30 = 0x400000003;
  local_28 = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_38;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_a0,__l,&local_a1);
  local_58 = 0x700000006;
  uStack_50 = 0x900000008;
  local_48 = 10;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_58;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_88,__l_00,&local_a2);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_a0;
  std::__cxx11::
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::list((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
          *)&local_70,__l_01,&local_a3);
  p_Var4 = (_List_node_base *)&local_70;
  do {
    p_Var1 = (_List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
              *)((long)p_Var4 + -0x18);
    p_Var4 = (_List_node_base *)((long)p_Var4 + -0x18);
    p_Var3 = (p_Var1->_M_impl)._M_node.super__List_node_base._M_next;
    while (p_Var3 != p_Var4) {
      p_Var2 = p_Var3->_M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var2;
    }
  } while (p_Var4 != (_List_node_base *)&local_a0);
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear(&local_70);
  return true;
}

Assistant:

bool test_SSTable_input() {
    auto l = std::list<std::list<int>>{{1, 2, 3, 4, 5},
                                       {6, 7, 8, 9, 10}};
    return true;
}